

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hittable.h
# Opt level: O3

bool __thiscall rotate_y::hit(rotate_y *this,ray *r,interval ray_t,hit_record *rec)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  int iVar5;
  
  iVar5 = (*((this->object).super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            _vptr_hittable[2])(ray_t.min,ray_t.max);
  if (SUB41(iVar5,0) != false) {
    dVar1 = this->sin_theta;
    dVar2 = this->cos_theta;
    dVar3 = (rec->p).e[0];
    dVar4 = (rec->p).e[2];
    (rec->p).e[0] = dVar2 * dVar3 + dVar1 * dVar4;
    (rec->p).e[2] = dVar2 * dVar4 - dVar1 * dVar3;
    dVar1 = this->sin_theta;
    dVar2 = this->cos_theta;
    dVar3 = (rec->normal).e[0];
    dVar4 = (rec->normal).e[2];
    (rec->normal).e[0] = dVar2 * dVar3 + dVar1 * dVar4;
    (rec->normal).e[2] = dVar2 * dVar4 - dVar1 * dVar3;
  }
  return SUB41(iVar5,0);
}

Assistant:

bool hit(const ray& r, interval ray_t, hit_record& rec) const override {

        // Transform the ray from world space to object space.

        auto origin = point3(
            (cos_theta * r.origin().x()) - (sin_theta * r.origin().z()),
            r.origin().y(),
            (sin_theta * r.origin().x()) + (cos_theta * r.origin().z())
        );

        auto direction = vec3(
            (cos_theta * r.direction().x()) - (sin_theta * r.direction().z()),
            r.direction().y(),
            (sin_theta * r.direction().x()) + (cos_theta * r.direction().z())
        );

        ray rotated_r(origin, direction, r.time());

        // Determine whether an intersection exists in object space (and if so, where).

        if (!object->hit(rotated_r, ray_t, rec))
            return false;

        // Transform the intersection from object space back to world space.

        rec.p = point3(
            (cos_theta * rec.p.x()) + (sin_theta * rec.p.z()),
            rec.p.y(),
            (-sin_theta * rec.p.x()) + (cos_theta * rec.p.z())
        );

        rec.normal = vec3(
            (cos_theta * rec.normal.x()) + (sin_theta * rec.normal.z()),
            rec.normal.y(),
            (-sin_theta * rec.normal.x()) + (cos_theta * rec.normal.z())
        );

        return true;
    }